

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hxx
# Opt level: O0

double __thiscall Graph::sqrt(Graph *this,double __x)

{
  double __x_00;
  double extraout_XMM0_Qa;
  Matrix local_110;
  Graph *local_10;
  Graph *this_local;
  
  local_10 = this;
  Matrix::transpose(&this->super_Matrix);
  Matrix::operator[](&local_110,&this->super_Matrix,1);
  Matrix::sqrt(&local_110,__x_00);
  Matrix::~Matrix(&local_110);
  Matrix::transpose(&this->super_Matrix);
  return extraout_XMM0_Qa;
}

Assistant:

Graph& sqrt() {
		transpose();
		operator[](1).sqrt();
		transpose();
		return *this;
	}